

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void insertSlice<float>(Box2i *dataWindow,FrameBuffer *frameBuffer,char *name,PixelType pixelType,
                       list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                       *channels)

{
  long lVar1;
  reference this;
  float *pfVar2;
  PixelType in_ECX;
  Slice *in_RDX;
  char *in_RSI;
  int *in_RDI;
  char *base;
  Array2D<float> *buffer;
  size_t height;
  size_t width;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  long in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  Array2D<float> *in_stack_ffffffffffffff80;
  
  lVar1 = (long)((in_RDI[2] - *in_RDI) + 1);
  std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::
  emplace_back<>((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  this = std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::
         back((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  Imf_3_4::Array2D<float>::resizeErase
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pfVar2 = Imf_3_4::Array2D<float>::operator[](this,0);
  Imf_3_4::Slice::Slice
            ((Slice *)&stack0xffffffffffffff80,in_ECX,
             (char *)(pfVar2 + (-(long)*in_RDI - in_RDI[1] * lVar1)),4,lVar1 << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(in_RSI,in_RDX);
  return;
}

Assistant:

void
insertSlice (
    Box2i&                    dataWindow,
    FrameBuffer&              frameBuffer,
    const char                name[],
    PixelType                 pixelType,
    list<Array2D<ValueType>>& channels)
{
    //
    // Allocate a pixel buffer and describe the layout of
    // the buffer in the FrameBuffer object.
    //

    size_t width  = dataWindow.max.x - dataWindow.min.x + 1;
    size_t height = dataWindow.max.y - dataWindow.min.y + 1;

    channels.emplace_back ();
    Array2D<ValueType>& buffer = channels.back ();
    buffer.resizeErase (height, width);

    char* base =
        (char*) (&buffer[0][0] - dataWindow.min.x - dataWindow.min.y * width);

    frameBuffer.insert (
        name, // name
        Slice (
            pixelType,                 // type
            base,                      // base
            sizeof (ValueType) * 1,    // xStride
            sizeof (ValueType) * width // yStride
            ));
}